

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9MLTest(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *pGVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  Vec_Wrd_t *__ptr;
  
  pcVar4 = (char *)0x0;
  Extra_UtilGetoptReset();
  bVar2 = false;
  do {
    while (iVar3 = Extra_UtilGetopt(argc,argv,"Dvh"), iVar3 == 0x76) {
      bVar2 = (bool)(bVar2 ^ 1);
    }
    if (iVar3 == -1) {
      pGVar1 = pAbc->pGia;
      if (pGVar1 != (Gia_Man_t *)0x0) {
        if (0 < pGVar1->nRegs) {
          pcVar4 = "Abc_CommandAbc9MLTest(): This command works only for combinational AIGs.\n";
          goto LAB_0027ba82;
        }
        __ptr = pGVar1->vSimsPi;
        if (__ptr != (Vec_Wrd_t *)0x0) {
          if (__ptr->pArray != (word *)0x0) {
            free(__ptr->pArray);
            pGVar1->vSimsPi->pArray = (word *)0x0;
            __ptr = pGVar1->vSimsPi;
            if (__ptr == (Vec_Wrd_t *)0x0) goto LAB_0027ba50;
          }
          free(__ptr);
          pGVar1->vSimsPi = (Vec_Wrd_t *)0x0;
        }
LAB_0027ba50:
        if (argc - globalUtilOptind == 1) {
          Gia_ManTestOneFile(pAbc->pGia,argv[globalUtilOptind],pcVar4);
          return 0;
        }
        pcVar4 = "Abc_CommandAbc9MLTest(): Expecting data file name on the command line.\n";
LAB_0027ba82:
        Abc_Print(-1,pcVar4);
        return 0;
      }
      pcVar4 = "Abc_CommandAbc9MLTest(): There is no AIG.\n";
      iVar3 = -1;
      goto LAB_0027bb28;
    }
    if (iVar3 != 0x44) goto LAB_0027baa8;
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-D\" should be followed by a file name.\n");
LAB_0027baa8:
      Abc_Print(-2,"usage: &mltest [-vh] [-D file] <file>\n");
      Abc_Print(-2,"\t          testing command for machine learning data\n");
      pcVar4 = "yes";
      if (!bVar2) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v      : toggle printing verbose information [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h      : print the command usage\n");
      Abc_Print(-2,"\t-D file : file name to dump statistics [default = none]\n");
      pcVar4 = "\tfile    : file with input simulation info\n";
      iVar3 = -2;
LAB_0027bb28:
      Abc_Print(iVar3,pcVar4);
      return 1;
    }
    pcVar4 = argv[globalUtilOptind];
    globalUtilOptind = globalUtilOptind + 1;
  } while( true );
}

Assistant:

int Abc_CommandAbc9MLTest( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ManTestOneFile( Gia_Man_t * p, char * pFileName, char * pDumpFile );
    int c, fVerbose = 0;
    char * pDumpFile = NULL;
    char ** pArgvNew;
    int nArgcNew;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Dvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by a file name.\n" );
                goto usage;
            }
            pDumpFile = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9MLTest(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) > 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9MLTest(): This command works only for combinational AIGs.\n" );
        return 0;
    }
    Vec_WrdFreeP( &pAbc->pGia->vSimsPi );
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "Abc_CommandAbc9MLTest(): Expecting data file name on the command line.\n" );
        return 0;
    }
    Gia_ManTestOneFile( pAbc->pGia, pArgvNew[0], pDumpFile );
    return 0;

usage:
    Abc_Print( -2, "usage: &mltest [-vh] [-D file] <file>\n" );
    Abc_Print( -2, "\t          testing command for machine learning data\n" );
    Abc_Print( -2, "\t-v      : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    Abc_Print( -2, "\t-D file : file name to dump statistics [default = none]\n" );
    Abc_Print( -2, "\tfile    : file with input simulation info\n");
    return 1;
}